

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.h
# Opt level: O1

SampledSpectrum __thiscall
pbrt::SpectrumMixTexture::Evaluate
          (SpectrumMixTexture *this,TextureEvalContext ctx,SampledWavelengths lambda)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Float FVar5;
  undefined8 uVar9;
  undefined1 auVar7 [16];
  undefined8 in_XMM1_Qa;
  SampledSpectrum SVar10;
  DispatchSplit<12> local_d1;
  TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
  local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  float afStack_b0 [2];
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  float afStack_90 [2];
  TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  local_88;
  float afStack_80 [2];
  float afStack_78 [2];
  float afStack_70 [2];
  Tuple3<pbrt::Point3,_float> local_68 [2];
  Tuple3<pbrt::Vector3,_float> aTStack_50 [3];
  int iStack_2c;
  float fVar6;
  float fVar8;
  
  local_68[0].x = ctx.p.super_Tuple3<pbrt::Point3,_float>.x;
  local_68[0].y = ctx.p.super_Tuple3<pbrt::Point3,_float>.y;
  local_68[0].z = ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
  local_68[1].x = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
  local_68[1].y = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
  local_68[1].z = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
  aTStack_50[0].x = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
  aTStack_50[0].y = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
  aTStack_50[0].z = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z;
  aTStack_50[1].x = ctx.uv.super_Tuple2<pbrt::Point2,_float>.x;
  aTStack_50[1].y = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
  aTStack_50[1].z = ctx.dudx;
  aTStack_50[2].x = ctx.dudy;
  aTStack_50[2].y = ctx.dvdx;
  aTStack_50[2].z = ctx.dvdy;
  iStack_2c = ctx.faceIndex;
  local_88.bits._0_4_ = lambda.lambda.values[0];
  local_88.bits._4_4_ = lambda.lambda.values[1];
  afStack_80[0] = lambda.lambda.values[2];
  afStack_80[1] = lambda.lambda.values[3];
  afStack_78[0] = lambda.pdf.values[0];
  afStack_78[1] = lambda.pdf.values[1];
  afStack_70[0] = lambda.pdf.values[2];
  afStack_70[1] = lambda.pdf.values[3];
  local_d0.bits =
       (this->tex1).
       super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
       .bits;
  uVar9 = lambda.lambda.values._8_8_;
  SVar10 = detail::DispatchSplit<12>::operator()
                     (&local_d1,local_68,&local_88,&local_d0,local_d0.bits >> 0x30);
  local_a8 = SVar10.values.values._8_8_;
  local_98 = SVar10.values.values._0_8_;
  local_68[0].x = ctx.p.super_Tuple3<pbrt::Point3,_float>.x;
  local_68[0].y = ctx.p.super_Tuple3<pbrt::Point3,_float>.y;
  local_68[0].z = ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
  local_68[1].x = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
  local_68[1].y = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
  local_68[1].z = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
  aTStack_50[0].x = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
  aTStack_50[0].y = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
  aTStack_50[0].z = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z;
  aTStack_50[1].x = ctx.uv.super_Tuple2<pbrt::Point2,_float>.x;
  aTStack_50[1].y = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
  aTStack_50[1].z = ctx.dudx;
  aTStack_50[2].x = ctx.dudy;
  aTStack_50[2].y = ctx.dvdx;
  aTStack_50[2].z = ctx.dvdy;
  iStack_2c = ctx.faceIndex;
  local_88.bits._0_4_ = lambda.lambda.values[0];
  local_88.bits._4_4_ = lambda.lambda.values[1];
  afStack_80[0] = lambda.lambda.values[2];
  afStack_80[1] = lambda.lambda.values[3];
  afStack_78[0] = lambda.pdf.values[0];
  afStack_78[1] = lambda.pdf.values[1];
  afStack_70[0] = lambda.pdf.values[2];
  afStack_70[1] = lambda.pdf.values[3];
  local_d0.bits =
       (this->tex2).
       super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
       .bits;
  uStack_a0 = in_XMM1_Qa;
  afStack_90 = (float  [2])uVar9;
  SVar10 = detail::DispatchSplit<12>::operator()
                     (&local_d1,local_68,&local_88,&local_d0,local_d0.bits >> 0x30);
  local_c8 = SVar10.values.values._8_8_;
  local_b8 = SVar10.values.values._0_8_;
  local_68[0].x = ctx.p.super_Tuple3<pbrt::Point3,_float>.x;
  local_68[0].y = ctx.p.super_Tuple3<pbrt::Point3,_float>.y;
  local_68[0].z = ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
  local_68[1].x = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
  local_68[1].y = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
  local_68[1].z = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
  aTStack_50[0].x = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
  aTStack_50[0].y = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
  aTStack_50[0].z = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z;
  aTStack_50[1].x = ctx.uv.super_Tuple2<pbrt::Point2,_float>.x;
  aTStack_50[1].y = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
  aTStack_50[1].z = ctx.dudx;
  aTStack_50[2].x = ctx.dudy;
  aTStack_50[2].y = ctx.dvdx;
  aTStack_50[2].z = ctx.dvdy;
  iStack_2c = ctx.faceIndex;
  local_88.bits =
       (this->amount).
       super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
       .bits;
  uStack_c0 = in_XMM1_Qa;
  afStack_b0 = (float  [2])lambda.lambda.values._8_8_;
  FVar5 = detail::DispatchSplit<12>::operator()
                    ((DispatchSplit<12> *)&local_d0,local_68,&local_88,local_88.bits >> 0x30);
  auVar4._8_4_ = afStack_90[0];
  auVar4._12_4_ = afStack_90[1];
  auVar4._0_8_ = local_98;
  auVar7._8_8_ = uStack_a0;
  auVar7._0_8_ = local_a8;
  auVar7 = vunpcklpd_avx(auVar4,auVar7);
  fVar1 = 1.0 - FVar5;
  auVar3._8_4_ = afStack_b0[0];
  auVar3._12_4_ = afStack_b0[1];
  auVar3._0_8_ = local_b8;
  auVar2._8_8_ = uStack_c0;
  auVar2._0_8_ = local_c8;
  auVar2 = vunpcklpd_avx(auVar3,auVar2);
  fVar6 = FVar5 * auVar2._0_4_ + fVar1 * auVar7._0_4_;
  fVar8 = FVar5 * auVar2._4_4_ + fVar1 * auVar7._4_4_;
  auVar7 = CONCAT412(FVar5 * auVar2._12_4_ + fVar1 * auVar7._12_4_,
                     CONCAT48(FVar5 * auVar2._8_4_ + fVar1 * auVar7._8_4_,CONCAT44(fVar8,fVar6)));
  auVar7 = vshufpd_avx(auVar7,auVar7,1);
  SVar10.values.values._8_8_ = auVar7._0_8_;
  SVar10.values.values[0] = fVar6;
  SVar10.values.values[1] = fVar8;
  return (SampledSpectrum)SVar10.values.values;
}

Assistant:

Evaluate(TextureEvalContext ctx, SampledWavelengths lambda) const {
        SampledSpectrum t1 = tex1.Evaluate(ctx, lambda);
        SampledSpectrum t2 = tex2.Evaluate(ctx, lambda);
        Float amt = amount.Evaluate(ctx);
        return (1 - amt) * t1 + amt * t2;
    }